

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O2

VarId __thiscall optimization::loop_expand::Rewriter::copy_var(Rewriter *this,VarId *var)

{
  VarId *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  mapped_type *__y;
  key_type *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  *this_01;
  VarId VVar4;
  uint32_t local_4c;
  pair<const_unsigned_int,_mir::inst::Variable> local_48;
  
  this_00 = var + 1;
  sVar1 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)this_00,in_RDX);
  if (sVar1 == 0) {
    local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = *(int *)&var[7].super_Displayable._vptr_Displayable + 1;
    *(uint32_t *)&var[7].super_Displayable._vptr_Displayable =
         (uint32_t)
         local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    this->func = (MirFunction *)&PTR_display_001d90d0;
    *(uint32_t *)&this->blk =
         (uint32_t)
         local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_48._0_8_ = &PTR_display_001d90d0;
    local_48.second.super_Displayable._vptr_Displayable._0_4_ = in_RDX->id;
    local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&PTR_display_001d90d0;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
    ::_M_insert_unique<std::pair<mir::inst::VarId_const,mir::inst::VarId>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
                *)this_00,(pair<const_mir::inst::VarId,_mir::inst::VarId> *)&local_48);
    this_01 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
               *)((var->super_Displayable)._vptr_Displayable + 7);
    local_4c = in_RDX->id;
    __y = std::
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                *)this_01,&local_4c);
    std::pair<const_unsigned_int,_mir::inst::Variable>::
    pair<mir::inst::VarId_&,_mir::inst::Variable_&,_true>(&local_48,(VarId *)this,__y);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,mir::inst::Variable>>(this_01,&local_48);
    mir::inst::Variable::~Variable(&local_48.second);
    uVar3 = extraout_RDX_00;
  }
  else {
    pmVar2 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)this_00,in_RDX);
    this->func = (MirFunction *)&PTR_display_001d90d0;
    *(uint32_t *)&this->blk = pmVar2->id;
    uVar3 = extraout_RDX;
  }
  VVar4._8_8_ = uVar3;
  VVar4.super_Displayable._vptr_Displayable = (_func_int **)this;
  return VVar4;
}

Assistant:

mir::inst::VarId copy_var(mir::inst::VarId var) {
    if (var_map.count(var)) {
      return var_map.at(var);
    }
    auto id = get_new_VarId();
    var_map.insert({var, id});
    func.variables.insert({id, func.variables.at(var)});
    return id;
  }